

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xvector.c
# Opt level: O3

void xvec_insert(xvec_t *xv,size_t pos,void *pvalues,size_t count)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar2 = xv->size;
  if (xv->capacity < sVar2 + count) {
    capacity_expand(xv,count);
    sVar2 = xv->size;
  }
  sVar1 = xv->val_size;
  memmove(xv->data + (count + pos) * sVar1,xv->data + sVar1 * pos,(sVar2 - pos) * sVar1);
  if (pvalues != (void *)0x0) {
    memcpy(xv->data + pos * xv->val_size,pvalues,xv->val_size * count);
  }
  xv->size = xv->size + count;
  return;
}

Assistant:

void xvec_insert(xvec_t* xv,
        size_t pos, const void* pvalues, size_t count)
{
    if (need_expand(xv, count))
        capacity_expand(xv, count);

    /* >>> */
    memmove(xvec_at(xv, pos + count), xvec_at(xv, pos),
            xv->val_size * (xv->size - pos));

    if (pvalues)
        memcpy(xvec_at(xv, pos), pvalues,
                xv->val_size * count);

    xv->size += count;
}